

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::remove_vertex(Graph *this,vertex_t v)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference pvVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  const_iterator local_88;
  uint *local_80;
  uint *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  value_type *__range1_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  const_iterator local_40;
  uint *local_38;
  uint *i;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  Graph *pGStack_10;
  vertex_t v_local;
  Graph *this_local;
  
  __range1._4_4_ = v;
  pGStack_10 = this;
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->pred_,(ulong)v);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar2);
  i = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&i);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1);
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->succ_,(ulong)*local_38);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->succ_,(ulong)*local_38);
    iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->succ_,(ulong)*local_38);
    iVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
    local_48 = std::
               find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                         (iVar4._M_current,iVar5._M_current,(uint *)((long)&__range1 + 4));
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_40,&local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(pvVar2,local_40);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->deg_,(ulong)*local_38);
    *pvVar6 = *pvVar6 - 1;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,(ulong)__range1._4_4_);
  __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar2);
  i_1 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&i_1);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1_1);
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->pred_,(ulong)*local_80);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->pred_,(ulong)*local_80);
    iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->pred_,(ulong)*local_80);
    iVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
    local_90 = std::
               find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                         (iVar4._M_current,iVar5._M_current,(uint *)((long)&__range1 + 4));
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_88,&local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(pvVar2,local_88);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->deg_,(ulong)*local_80);
    *pvVar6 = *pvVar6 - 1;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1_1);
  }
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&this->deg_,(ulong)__range1._4_4_);
  *pvVar6 = 0;
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,(ulong)__range1._4_4_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(pvVar2);
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->pred_,(ulong)__range1._4_4_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(pvVar2);
  return;
}

Assistant:

void Graph::remove_vertex(vertex_t v) {
    for (const auto &i : pred_.at(v)) {
        succ_.at(i).erase(find(succ_.at(i).begin(), succ_.at(i).end(), v));
        --deg_.at(i);
    }
    for (const auto &i : succ_.at(v)) {
        pred_.at(i).erase(find(pred_.at(i).begin(), pred_.at(i).end(), v));
        --deg_.at(i);
    }
    deg_.at(v) = 0;

    succ_.at(v).clear();
    pred_.at(v).clear();
}